

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_contact.h
# Opt level: O0

void __thiscall
GIM_CONTACT::interpolate_normals(GIM_CONTACT_conflict *this,btVector3 *normals,uint normal_count)

{
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  btScalar bVar1;
  btVector3 bVar2;
  uint _y;
  btScalar _x;
  btScalar vec_sum_len;
  uint i;
  btVector3 vec_sum;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_28;
  btVector3 local_24;
  uint local_14;
  long local_10;
  
  local_24.m_floats._0_8_ = *(undefined8 *)(in_RDI + 0x10);
  local_24.m_floats._8_8_ = *(undefined8 *)(in_RDI + 0x18);
  local_14 = in_EDX;
  local_10 = in_RSI;
  for (local_28 = 0; local_28 < local_14; local_28 = local_28 + 1) {
    btVector3::operator+=(&local_24,(btVector3 *)(local_10 + (ulong)local_28 * 0x10));
  }
  bVar1 = btVector3::length2((btVector3 *)0x1dccd1);
  if (1e-05 <= bVar1) {
    bVar2 = ::operator*((btVector3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        (btScalar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    *(long *)(in_RDI + 0x10) = bVar2.m_floats._0_8_;
    *(long *)(in_RDI + 0x18) = bVar2.m_floats._8_8_;
  }
  return;
}

Assistant:

SIMD_FORCE_INLINE void interpolate_normals( btVector3 * normals,GUINT normal_count)
    {
    	btVector3 vec_sum(m_normal);
		for(GUINT i=0;i<normal_count;i++)
		{
			vec_sum += normals[i];
		}

		GREAL vec_sum_len = vec_sum.length2();
		if(vec_sum_len <CONTACT_DIFF_EPSILON) return;

		GIM_INV_SQRT(vec_sum_len,vec_sum_len); // 1/sqrt(vec_sum_len)

		m_normal = vec_sum*vec_sum_len;
    }